

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

TypeArray * __thiscall
soul::AST::Function::getParameterTypes(TypeArray *__return_storage_ptr__,Function *this)

{
  Type *pTVar1;
  pointer ppVar2;
  Type *pTVar3;
  size_t sVar4;
  pointer ppVar5;
  Type local_38;
  
  __return_storage_ptr__->items = (Type *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 8;
  ArrayWithPreallocation<soul::Type,_8UL>::reserve
            (__return_storage_ptr__,
             (long)(this->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar2 = (this->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (this->parameters).
                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    VariableDeclaration::getType(&local_38,ppVar5->object);
    ArrayWithPreallocation<soul::Type,_8UL>::reserve
              (__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
    pTVar3 = __return_storage_ptr__->items;
    sVar4 = __return_storage_ptr__->numActive;
    pTVar1 = pTVar3 + sVar4;
    pTVar1->category = local_38.category;
    pTVar1->arrayElementCategory = local_38.arrayElementCategory;
    pTVar1->isRef = local_38.isRef;
    pTVar1->isConstant = local_38.isConstant;
    pTVar3[sVar4].primitiveType.type = local_38.primitiveType.type;
    pTVar3[sVar4].boundingSize = local_38.boundingSize;
    pTVar3[sVar4].arrayElementBoundingSize = local_38.arrayElementBoundingSize;
    pTVar3[sVar4].structure.object = local_38.structure.object;
    local_38.structure.object = (Structure *)0x0;
    __return_storage_ptr__->numActive = __return_storage_ptr__->numActive + 1;
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeArray getParameterTypes() const
        {
            TypeArray types;
            types.reserve (parameters.size());

            for (auto& param : parameters)
                types.push_back (param->getType());

            return types;
        }